

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O3

vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> * __thiscall
QPDFPageDocumentHelper::getAllPages
          (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           *__return_storage_ptr__,QPDFPageDocumentHelper *this)

{
  pointer pQVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar2;
  QPDFObjectHandle *iter;
  pointer __args;
  
  (__return_storage_ptr__->
  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = QPDF::getAllPages((this->super_QPDFDocumentHelper).qpdf);
  pQVar1 = (pvVar2->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (__args = (pvVar2->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; __args != pQVar1; __args = __args + 1) {
    std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
    emplace_back<QPDFObjectHandle_const&>
              ((vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>> *)
               __return_storage_ptr__,__args);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFPageObjectHelper>
QPDFPageDocumentHelper::getAllPages()
{
    std::vector<QPDFPageObjectHelper> pages;
    for (auto const& iter: this->qpdf.getAllPages()) {
        pages.emplace_back(iter);
    }
    return pages;
}